

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender-c.cpp
# Opt level: O0

char * duckdb_appender_error(duckdb_appender appender)

{
  ulong uVar1;
  long in_RDI;
  AppenderWrapper *wrapper;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      local_8 = (char *)std::__cxx11::string::c_str();
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

const char *duckdb_appender_error(duckdb_appender appender) {
	if (!appender) {
		return nullptr;
	}
	auto wrapper = reinterpret_cast<AppenderWrapper *>(appender);
	if (wrapper->error.empty()) {
		return nullptr;
	}
	return wrapper->error.c_str();
}